

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles31::Functional::UniformCase::iterate(UniformCase *this)

{
  pointer log;
  UniformCollection *pUVar1;
  pointer pUVar2;
  RenderContext *pRVar3;
  deUint32 dVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  int i;
  long lVar8;
  long lVar9;
  allocator<char> local_41a;
  allocator<char> local_419;
  vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
  basicUniforms;
  Random rnd;
  vector<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
  basicUniformReportsRef;
  string local_3d0;
  string local_3b0;
  string fragmentSource;
  string vertexSource;
  int samplerUnitCounter;
  uint uStack_34c;
  ostringstream local_348 [376];
  ShaderProgram dummyProgram;
  ShaderProgram program;
  
  dVar4 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  uVar5 = tcu::CommandLine::getBaseSeed(((this->super_TestCase).m_context)->m_testCtx->m_cmdLine);
  deRandom_init(&rnd.m_rnd,dVar4 ^ uVar5);
  log = (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  basicUniforms.
  super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  basicUniforms.
  super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  basicUniforms.
  super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  basicUniformReportsRef.
  super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  basicUniformReportsRef.
  super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  basicUniformReportsRef.
  super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _samplerUnitCounter = (pointer)((ulong)uStack_34c << 0x20);
  lVar9 = 0x20;
  for (lVar8 = 0; pUVar1 = (this->m_uniformCollection).m_ptr,
      pUVar2 = (pUVar1->m_uniforms).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar8 < (int)(((long)(pUVar1->m_uniforms).
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2) / 0x38);
      lVar8 = lVar8 + 1) {
    generateBasicUniforms
              (this,&basicUniforms,&basicUniformReportsRef,
               (VarType *)((long)&(pUVar2->name)._M_dataplus._M_p + lVar9),
               *(char **)((long)pUVar2 + lVar9 + -0x20),true,&samplerUnitCounter,&rnd);
    lVar9 = lVar9 + 0x38;
  }
  generateVertexSource_abi_cxx11_(&vertexSource,this,&basicUniforms);
  generateFragmentSource_abi_cxx11_(&fragmentSource,this,&basicUniforms);
  pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
  glu::makeVtxFragSources((ProgramSources *)&samplerUnitCounter,&vertexSource,&fragmentSource);
  glu::ShaderProgram::ShaderProgram(&program,pRVar3,(ProgramSources *)&samplerUnitCounter);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&samplerUnitCounter);
  pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b0,"#version 310 es\nvoid main (void) { gl_Position = vec4(1.0); }\n"
             ,&local_419);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,
             "#version 310 es\nlayout(location = 0) out mediump vec4 dEQP_FragColor;\nvoid main (void) { dEQP_FragColor = vec4(0.0, 0.0, 1.0, 1.0); }\n"
             ,&local_41a);
  glu::makeVtxFragSources((ProgramSources *)&samplerUnitCounter,&local_3b0,&local_3d0);
  glu::ShaderProgram::ShaderProgram(&dummyProgram,pRVar3,(ProgramSources *)&samplerUnitCounter);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&samplerUnitCounter);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3b0);
  glu::operator<<((TestLog *)log,&program);
  if (program.m_program.m_info.linkOk == false) {
    pcVar7 = "Compile failed";
  }
  else {
    if (dummyProgram.m_program.m_info.linkOk != false) {
      _samplerUnitCounter = log;
      std::__cxx11::ostringstream::ostringstream(local_348);
      std::operator<<((ostream *)local_348,
                      "// Note: calling glUseProgram with a dummy program (will only use the real program once it\'s needed for rendering)"
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&samplerUnitCounter,(EndMessageToken *)&tcu::TestLog::EndMessage)
      ;
      std::__cxx11::ostringstream::~ostringstream(local_348);
      glu::CallLogWrapper::glUseProgram
                (&this->super_CallLogWrapper,dummyProgram.m_program.m_program);
      iVar6 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                        (this,&basicUniforms,&basicUniformReportsRef,&program,&rnd);
      pcVar7 = "Failed";
      if ((byte)iVar6 != 0) {
        pcVar7 = "Passed";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (uint)(byte)((byte)iVar6 ^ 1),pcVar7);
      goto LAB_012e275d;
    }
    glu::operator<<((TestLog *)log,&dummyProgram);
    pcVar7 = "Compilation of dummy program failed";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
             pcVar7);
LAB_012e275d:
  glu::ShaderProgram::~ShaderProgram(&dummyProgram);
  glu::ShaderProgram::~ShaderProgram(&program);
  std::__cxx11::string::~string((string *)&fragmentSource);
  std::__cxx11::string::~string((string *)&vertexSource);
  std::
  vector<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
  ::~vector(&basicUniformReportsRef);
  std::
  vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
  ::~vector(&basicUniforms);
  return STOP;
}

Assistant:

UniformCase::IterateResult UniformCase::iterate (void)
{
	Random							rnd				(deStringHash(getName()) ^ (deUint32)m_context.getTestContext().getCommandLine().getBaseSeed());
	TestLog&						log				= m_testCtx.getLog();
	vector<BasicUniform>			basicUniforms;
	vector<BasicUniformReportRef>	basicUniformReportsRef;

	{
		int samplerUnitCounter = 0;
		for (int i = 0; i < (int)m_uniformCollection->getNumUniforms(); i++)
			generateBasicUniforms(basicUniforms, basicUniformReportsRef, m_uniformCollection->getUniform(i).type, m_uniformCollection->getUniform(i).name.c_str(), true, samplerUnitCounter, rnd);
	}

	const string					vertexSource	= generateVertexSource(basicUniforms);
	const string					fragmentSource	= generateFragmentSource(basicUniforms);
	const ShaderProgram				program			(m_context.getRenderContext(), glu::makeVtxFragSources(vertexSource, fragmentSource));

	// A dummy program that we'll give to glUseProgram before we actually need
	// the real program above, to see if an implementation tries to use the
	// currently active program for something inappropriate (instead of the
	// program given as argument to, say, glProgramUniform*).
	const ShaderProgram				dummyProgram	(m_context.getRenderContext(), glu::makeVtxFragSources("#version 310 es\n"
																										   "void main (void) { gl_Position = vec4(1.0); }\n",

																										   "#version 310 es\n"
																										   "layout(location = 0) out mediump vec4 dEQP_FragColor;\n"
																										   "void main (void) { dEQP_FragColor = vec4(0.0, 0.0, 1.0, 1.0); }\n"));

	log << program;

	if (!program.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile failed");
		return STOP;
	}

	if (!dummyProgram.isOk())
	{
		log << dummyProgram;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compilation of dummy program failed");
		return STOP;
	}

	log << TestLog::Message << "// Note: calling glUseProgram with a dummy program (will only use the real program once it's needed for rendering)" << TestLog::EndMessage;
	glUseProgram(dummyProgram.getProgram());

	const bool success = test(basicUniforms, basicUniformReportsRef, program, rnd);
	m_testCtx.setTestResult(success ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							success ? "Passed"				: "Failed");

	return STOP;
}